

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.h
# Opt level: O0

void __thiscall
absl::lts_20250127::status_internal::StatusRep::StatusRep
          (StatusRep *this,StatusCode code_arg,string_view message_arg,
          unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
          *payloads_arg)

{
  allocator<char> local_31;
  unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
  *local_30;
  unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
  *payloads_arg_local;
  StatusRep *pSStack_20;
  StatusCode code_arg_local;
  StatusRep *this_local;
  string_view message_arg_local;
  
  message_arg_local._M_len = (size_t)message_arg._M_str;
  this_local = (StatusRep *)message_arg._M_len;
  local_30 = payloads_arg;
  payloads_arg_local._4_4_ = code_arg;
  pSStack_20 = this;
  std::atomic<int>::atomic(&this->ref_,1);
  this->code_ = payloads_arg_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->message_,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::
  unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
  ::unique_ptr(&this->payloads_,payloads_arg);
  return;
}

Assistant:

StatusRep(absl::StatusCode code_arg, absl::string_view message_arg,
            std::unique_ptr<status_internal::Payloads> payloads_arg)
      : ref_(int32_t{1}),
        code_(code_arg),
        message_(message_arg),
        payloads_(std::move(payloads_arg)) {}